

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O1

void MARGINAL::save_load(data *sm,io_buf *io,bool read,bool text)

{
  vw *pvVar1;
  data *pdVar2;
  uint32_t *puVar3;
  ostream *poVar4;
  _Hash_node_base *p_Var5;
  ulong uVar6;
  uint64_t total_size;
  float w2;
  float c2;
  float r2;
  float w1;
  double denominator;
  double numerator;
  uint64_t index;
  stringstream msg;
  size_type local_228;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  _Hash_node_base *local_210;
  _Hash_node_base *local_208;
  ulong local_200;
  ulong local_1f8;
  data *local_1f0;
  uint local_1e4;
  long local_1e0;
  _Hash_node_base *local_1d8;
  undefined8 local_1d0;
  float local_1c8;
  float local_1c4;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pvVar1 = sm->all;
  puVar3 = &(pvVar1->weights).dense_weights._stride_shift;
  if ((pvVar1->weights).sparse != false) {
    puVar3 = &(pvVar1->weights).sparse_weights._stride_shift;
  }
  if ((io->files)._end != (io->files)._begin) {
    local_1f8 = (ulong)*puVar3;
    local_1f0 = sm;
    std::__cxx11::stringstream::stringstream(local_1b8);
    if (!read) {
      local_228 = (local_1f0->marginals)._M_h._M_element_count;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"marginals size = ",0x11);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    }
    local_1e4 = (uint)read;
    bin_text_read_write_fixed_validated
              (io,(char *)&local_228,8,"",read,(stringstream *)local_1b8,text);
    if (local_228 != 0) {
      local_1c0 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                   *)&local_1f0->marginals;
      p_Var5 = (local_1f0->marginals)._M_h._M_before_begin._M_nxt;
      uVar6 = 0;
      do {
        if (read) {
LAB_0025be60:
          io_buf::bin_read_fixed(io,(char *)&local_200,8,"");
        }
        else {
          local_200 = (ulong)p_Var5[1]._M_nxt >> ((byte)local_1f8 & 0x3f);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
          if (read) goto LAB_0025be60;
          bin_text_write_fixed(io,(char *)&local_200,8,(stringstream *)local_1b8,text);
        }
        if (read) {
LAB_0025bec5:
          io_buf::bin_read_fixed(io,(char *)&local_208,8,"");
        }
        else {
          local_208 = p_Var5[2]._M_nxt;
          poVar4 = std::ostream::_M_insert<double>((double)local_208);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
          if (read) goto LAB_0025bec5;
          bin_text_write_fixed(io,(char *)&local_208,8,(stringstream *)local_1b8,text);
        }
        if (read) {
LAB_0025bf2a:
          io_buf::bin_read_fixed(io,(char *)&local_210,8,"");
        }
        else {
          local_210 = p_Var5[3]._M_nxt;
          poVar4 = std::ostream::_M_insert<double>((double)local_210);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          if (read) goto LAB_0025bf2a;
          bin_text_write_fixed(io,(char *)&local_210,8,(stringstream *)local_1b8,text);
        }
        if (read) {
          local_1e0 = local_200 << ((byte)local_1f8 & 0x3f);
          local_1d8 = local_208;
          local_1d0 = local_210;
          std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,std::pair<double,double>>>(local_1c0,&local_1e0);
        }
        else {
          p_Var5 = p_Var5->_M_nxt;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_228);
    }
    pdVar2 = local_1f0;
    if (local_1f0->compete != false) {
      if (!read) {
        local_228 = (local_1f0->expert_state)._M_h._M_element_count;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"expert_state size = ",0x14);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      }
      bin_text_read_write_fixed_validated
                (io,(char *)&local_228,8,"",SUB41(local_1e4,0),(stringstream *)local_1b8,text);
      if (local_228 != 0) {
        p_Var5 = (pdVar2->expert_state)._M_h._M_before_begin._M_nxt;
        uVar6 = 0;
        do {
          if (read) {
LAB_0025c09b:
            io_buf::bin_read_fixed(io,(char *)&local_200,8,"");
          }
          else {
            local_200 = (ulong)p_Var5[1]._M_nxt >> ((byte)local_1f8 & 0x3f);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
            if (read) goto LAB_0025c09b;
            bin_text_write_fixed(io,(char *)&local_200,8,(stringstream *)local_1b8,text);
          }
          if (read) {
LAB_0025c146:
            io_buf::bin_read_fixed(io,(char *)&local_208,4,"");
          }
          else {
            local_208 = (_Hash_node_base *)CONCAT44(local_208._4_4_,*(float *)&p_Var5[2]._M_nxt);
            local_210 = (_Hash_node_base *)
                        CONCAT44(local_210._4_4_,*(undefined4 *)((long)&p_Var5[2]._M_nxt + 4));
            local_214 = *(float *)&p_Var5[3]._M_nxt;
            local_218 = *(float *)((long)&p_Var5[3]._M_nxt + 4);
            local_21c = *(float *)&p_Var5[4]._M_nxt;
            local_220 = *(float *)((long)&p_Var5[4]._M_nxt + 4);
            poVar4 = std::ostream::_M_insert<double>((double)*(float *)&p_Var5[2]._M_nxt);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
            if (read) goto LAB_0025c146;
            bin_text_write_fixed(io,(char *)&local_208,4,(stringstream *)local_1b8,text);
          }
          if (read) {
LAB_0025c1ae:
            io_buf::bin_read_fixed(io,(char *)&local_210,4,"");
          }
          else {
            poVar4 = std::ostream::_M_insert<double>((double)local_210._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
            if (read) goto LAB_0025c1ae;
            bin_text_write_fixed(io,(char *)&local_210,4,(stringstream *)local_1b8,text);
          }
          if (read) {
LAB_0025c216:
            io_buf::bin_read_fixed(io,(char *)&local_214,4,"");
          }
          else {
            poVar4 = std::ostream::_M_insert<double>((double)local_214);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
            if (read) goto LAB_0025c216;
            bin_text_write_fixed(io,(char *)&local_214,4,(stringstream *)local_1b8,text);
          }
          if (read) {
LAB_0025c27e:
            io_buf::bin_read_fixed(io,(char *)&local_218,4,"");
          }
          else {
            poVar4 = std::ostream::_M_insert<double>((double)local_218);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
            if (read) goto LAB_0025c27e;
            bin_text_write_fixed(io,(char *)&local_218,4,(stringstream *)local_1b8,text);
          }
          if (read) {
LAB_0025c2e6:
            io_buf::bin_read_fixed(io,(char *)&local_21c,4,"");
          }
          else {
            poVar4 = std::ostream::_M_insert<double>((double)local_21c);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
            if (read) goto LAB_0025c2e6;
            bin_text_write_fixed(io,(char *)&local_21c,4,(stringstream *)local_1b8,text);
          }
          if (read) {
LAB_0025c34e:
            io_buf::bin_read_fixed(io,(char *)&local_220,4,"");
          }
          else {
            poVar4 = std::ostream::_M_insert<double>((double)local_220);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
            if (read) goto LAB_0025c34e;
            bin_text_write_fixed(io,(char *)&local_220,4,(stringstream *)local_1b8,text);
          }
          if (read) {
            local_1e0 = local_200 << ((byte)local_1f8 & 0x3f);
            local_1d8 = (_Hash_node_base *)CONCAT44(local_210._0_4_,(int)local_208);
            local_1d0 = (_Hash_node_base *)CONCAT44(local_218,local_214);
            local_1c8 = local_21c;
            local_1c4 = local_220;
            std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&pdVar2->expert_state,&local_1e0);
          }
          else {
            p_Var5 = p_Var5->_M_nxt;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < local_228);
      }
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void save_load(data& sm, io_buf& io, bool read, bool text)
{
  uint64_t stride_shift = sm.all->weights.stride_shift();

  if (io.files.size() == 0)
    return;
  stringstream msg;
  uint64_t total_size;
  if (!read)
  {
    total_size = (uint64_t)sm.marginals.size();
    msg << "marginals size = " << total_size << "\n";
  }
  bin_text_read_write_fixed_validated(io, (char*)&total_size, sizeof(total_size), "", read, msg, text);

  auto iter = sm.marginals.begin();
  for (size_t i = 0; i < total_size; ++i)
  {
    uint64_t index;
    if (!read)
    {
      index = iter->first >> stride_shift;
      msg << index << ":";
    }
    bin_text_read_write_fixed(io, (char*)&index, sizeof(index), "", read, msg, text);
    double numerator;
    if (!read)
    {
      numerator = iter->second.first;
      msg << numerator << ":";
    }
    bin_text_read_write_fixed(io, (char*)&numerator, sizeof(numerator), "", read, msg, text);
    double denominator;
    if (!read)
    {
      denominator = iter->second.second;
      msg << denominator << "\n";
    }
    bin_text_read_write_fixed(io, (char*)&denominator, sizeof(denominator), "", read, msg, text);
    if (read)
      sm.marginals.insert(make_pair(index << stride_shift, make_pair(numerator, denominator)));
    else
      ++iter;
  }

  if (sm.compete)
  {
    if (!read)
    {
      total_size = (uint64_t)sm.expert_state.size();
      msg << "expert_state size = " << total_size << "\n";
    }
    bin_text_read_write_fixed_validated(io, (char*)&total_size, sizeof(total_size), "", read, msg, text);

    auto exp_iter = sm.expert_state.begin();
    for (size_t i = 0; i < total_size; ++i)
    {
      uint64_t index;
      if (!read)
      {
        index = exp_iter->first >> stride_shift;
        msg << index << ":";
      }
      bin_text_read_write_fixed(io, (char*)&index, sizeof(index), "", read, msg, text);
      float r1, c1, w1, r2, c2, w2;
      if (!read)
      {
        r1 = exp_iter->second.first.regret;
        c1 = exp_iter->second.first.abs_regret;
        w1 = exp_iter->second.first.weight;
        r2 = exp_iter->second.second.regret;
        c2 = exp_iter->second.second.abs_regret;
        w2 = exp_iter->second.second.weight;
        msg << r1 << ":";
      }
      bin_text_read_write_fixed(io, (char*)&r1, sizeof(r1), "", read, msg, text);
      if (!read)
        msg << c1 << ":";
      bin_text_read_write_fixed(io, (char*)&c1, sizeof(c1), "", read, msg, text);
      if (!read)
        msg << w1 << ":";
      bin_text_read_write_fixed(io, (char*)&w1, sizeof(w1), "", read, msg, text);
      if (!read)
        msg << r2 << ":";
      bin_text_read_write_fixed(io, (char*)&r2, sizeof(r2), "", read, msg, text);
      if (!read)
        msg << c2 << ":";
      bin_text_read_write_fixed(io, (char*)&c2, sizeof(c2), "", read, msg, text);
      if (!read)
        msg << w2 << ":";
      bin_text_read_write_fixed(io, (char*)&w2, sizeof(w2), "", read, msg, text);

      if (read)
      {
        expert e1 = {r1, c1, w1};
        expert e2 = {r2, c2, w2};
        sm.expert_state.insert(make_pair(index << stride_shift, make_pair(e1, e2)));
      }
      else
        ++exp_iter;
    }
  }
}